

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::clear(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this)

{
  chunk *pcVar1;
  chunk *pcVar2;
  
  unwind(this);
  pcVar2 = this->current_chunk_;
  while (pcVar2 != (chunk *)0x0) {
    pcVar1 = pcVar2->next_;
    operator_delete(pcVar2->begin_);
    operator_delete(pcVar2);
    this->current_chunk_ = pcVar1;
    pcVar2 = pcVar1;
  }
  this->begin_ = (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
  this->curr_ = (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  this->end_ = (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  return;
}

Assistant:

void clear()
    {
        // walk to the front of the list
        this->unwind();

        // delete the list
        for(chunk *next; this->current_chunk_; this->current_chunk_ = next)
        {
            next = this->current_chunk_->next_;
            delete this->current_chunk_;
        }

        this->begin_ = this->curr_ = this->end_ = 0;
    }